

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax*>::
emplace_back<slang::syntax::ConfigInstanceIdentifierSyntax*>
          (SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax*> *this,
          ConfigInstanceIdentifierSyntax **args)

{
  iterator ppCVar1;
  ConfigInstanceIdentifierSyntax **args_local;
  SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*> *this_local;
  
  if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
    ppCVar1 = SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>::end
                        ((SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*> *)this);
    this_local = (SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*> *)
                 emplaceRealloc<slang::syntax::ConfigInstanceIdentifierSyntax*>(this,ppCVar1,args);
  }
  else {
    ppCVar1 = SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>::end
                        ((SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*> *)this);
    *ppCVar1 = *args;
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    this_local = (SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*> *)
                 SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>::back
                           ((SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*> *)this
                           );
  }
  return (reference)this_local;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }